

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O3

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,double c)

{
  double dVar1;
  double dVar2;
  long lVar3;
  Matrix3x3 *B;
  undefined8 uVar4;
  
  lVar3 = 0;
  do {
    uVar4 = 0x3ff0000000000000;
    if (lVar3 != 0) {
      uVar4 = 0;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->entries[0].field_0 + lVar3) = uVar4;
    uVar4 = 0x3ff0000000000000;
    if (lVar3 != 8) {
      uVar4 = 0;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->entries[1].field_0 + lVar3) = uVar4;
    uVar4 = 0x3ff0000000000000;
    if (lVar3 != 0x10) {
      uVar4 = 0;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->entries[2].field_0 + lVar3) = uVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  dVar1 = this->entries[0].field_0.field_0.z;
  dVar2 = this->entries[0].field_0.field_0.y;
  __return_storage_ptr__->entries[0].field_0.field_0.x = c * this->entries[0].field_0.field_0.x;
  __return_storage_ptr__->entries[0].field_0.field_0.y = c * dVar2;
  __return_storage_ptr__->entries[0].field_0.field_0.z = c * dVar1;
  dVar1 = this->entries[1].field_0.field_0.z;
  dVar2 = this->entries[1].field_0.field_0.y;
  __return_storage_ptr__->entries[1].field_0.field_0.x = c * this->entries[1].field_0.field_0.x;
  __return_storage_ptr__->entries[1].field_0.field_0.y = c * dVar2;
  __return_storage_ptr__->entries[1].field_0.field_0.z = c * dVar1;
  dVar1 = this->entries[2].field_0.field_0.z;
  dVar2 = this->entries[2].field_0.field_0.y;
  __return_storage_ptr__->entries[2].field_0.field_0.x = c * this->entries[2].field_0.field_0.x;
  __return_storage_ptr__->entries[2].field_0.field_0.y = c * dVar2;
  __return_storage_ptr__->entries[2].field_0.field_0.z = c * dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( double c ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B[0] = A[0] * c;
    B[1] = A[1] * c;
    B[2] = A[2] * c;

    return B;
  }